

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O0

int alsa_allocate_recorder(ALLEGRO_AUDIO_RECORDER *r)

{
  long lVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  long in_RDI;
  int err_8;
  int err_7;
  int err_6;
  int err_5;
  int err_4;
  int err_3;
  int err_2;
  int err_1;
  int err;
  char *config_device;
  char *device;
  snd_pcm_format_t format;
  uint frequency;
  ALSA_RECORDER_DATA *data;
  char *local_28;
  undefined4 local_20;
  int local_1c;
  long *local_18;
  long local_10;
  
  local_1c = *(int *)(in_RDI + 0xa0);
  local_28 = default_device;
  local_10 = in_RDI;
  uVar4 = al_get_system_config();
  pcVar5 = (char *)al_get_config_value(uVar4,"alsa","capture_device");
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    local_28 = pcVar5;
  }
  local_18 = (long *)al_calloc_with_context
                               (1,0x10,0x32a,
                                "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                ,"alsa_allocate_recorder");
  if (local_18 != (long *)0x0) {
    if (*(int *)(local_10 + 0x98) == 0) {
      local_20 = 0;
    }
    else if (*(int *)(local_10 + 0x98) == 8) {
      local_20 = 1;
    }
    else if (*(int *)(local_10 + 0x98) == 1) {
      local_20 = 2;
    }
    else if (*(int *)(local_10 + 0x98) == 9) {
      local_20 = 4;
    }
    else if (*(int *)(local_10 + 0x98) == 2) {
      local_20 = 6;
    }
    else if (*(int *)(local_10 + 0x98) == 10) {
      local_20 = 8;
    }
    else {
      if (*(int *)(local_10 + 0x98) != 3) goto LAB_001164fd;
      local_20 = 0xe;
    }
    iVar3 = snd_pcm_open(local_18,local_28,1,0);
    if (iVar3 < 0) {
      uVar6 = _al_trace_prefix(__al_debug_channel,3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                               ,0x341,"alsa_allocate_recorder");
      if ((uVar6 & 1) != 0) {
        uVar4 = snd_strerror(iVar3);
        _al_trace_suffix("%s: %s\n",uVar4,
                         "snd_pcm_open(&data->capture_handle, device, SND_PCM_STREAM_CAPTURE, 0)");
      }
    }
    else {
      iVar3 = snd_pcm_hw_params_malloc(local_18 + 1);
      if (iVar3 < 0) {
        uVar6 = _al_trace_prefix(__al_debug_channel,3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                 ,0x342,"alsa_allocate_recorder");
        if ((uVar6 & 1) != 0) {
          uVar4 = snd_strerror(iVar3);
          _al_trace_suffix("%s: %s\n",uVar4,"snd_pcm_hw_params_malloc(&data->hw_params)");
        }
      }
      else {
        iVar3 = snd_pcm_hw_params_any(*local_18,local_18[1]);
        if (iVar3 < 0) {
          uVar6 = _al_trace_prefix(__al_debug_channel,3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                   ,0x343,"alsa_allocate_recorder");
          if ((uVar6 & 1) != 0) {
            uVar4 = snd_strerror(iVar3);
            _al_trace_suffix("%s: %s\n",uVar4,
                             "snd_pcm_hw_params_any(data->capture_handle, data->hw_params)");
          }
        }
        else {
          iVar3 = snd_pcm_hw_params_set_access(*local_18,local_18[1],3);
          if (iVar3 < 0) {
            uVar6 = _al_trace_prefix(__al_debug_channel,3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                     ,0x344,"alsa_allocate_recorder");
            if ((uVar6 & 1) != 0) {
              uVar4 = snd_strerror(iVar3);
              _al_trace_suffix("%s: %s\n",uVar4,
                               "snd_pcm_hw_params_set_access(data->capture_handle, data->hw_params, SND_PCM_ACCESS_RW_INTERLEAVED)"
                              );
            }
          }
          else {
            iVar3 = snd_pcm_hw_params_set_format(*local_18,local_18[1],local_20);
            if (iVar3 < 0) {
              uVar6 = _al_trace_prefix(__al_debug_channel,3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                       ,0x345,"alsa_allocate_recorder");
              if ((uVar6 & 1) != 0) {
                uVar4 = snd_strerror(iVar3);
                _al_trace_suffix("%s: %s\n",uVar4,
                                 "snd_pcm_hw_params_set_format(data->capture_handle, data->hw_params, format)"
                                );
              }
            }
            else {
              iVar3 = snd_pcm_hw_params_set_rate_near(*local_18,local_18[1],&local_1c,0);
              if (iVar3 < 0) {
                uVar6 = _al_trace_prefix(__al_debug_channel,3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                         ,0x346,"alsa_allocate_recorder");
                if ((uVar6 & 1) != 0) {
                  uVar4 = snd_strerror(iVar3);
                  _al_trace_suffix("%s: %s\n",uVar4,
                                   "snd_pcm_hw_params_set_rate_near(data->capture_handle, data->hw_params, &frequency, 0)"
                                  );
                }
              }
              else if (local_1c == *(int *)(local_10 + 0xa0)) {
                lVar1 = *local_18;
                lVar2 = local_18[1];
                sVar7 = al_get_channel_count(*(ALLEGRO_CHANNEL_CONF *)(local_10 + 0x9c));
                iVar3 = snd_pcm_hw_params_set_channels(lVar1,lVar2,sVar7 & 0xffffffff);
                if (iVar3 < 0) {
                  uVar6 = _al_trace_prefix(__al_debug_channel,3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                           ,0x34d,"alsa_allocate_recorder");
                  if ((uVar6 & 1) != 0) {
                    uVar4 = snd_strerror(iVar3);
                    _al_trace_suffix("%s: %s\n",uVar4,
                                     "snd_pcm_hw_params_set_channels(data->capture_handle, data->hw_params, al_get_channel_count(r->chan_conf))"
                                    );
                  }
                }
                else {
                  iVar3 = snd_pcm_hw_params(*local_18,local_18[1]);
                  if (iVar3 < 0) {
                    uVar6 = _al_trace_prefix(__al_debug_channel,3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                             ,0x34e,"alsa_allocate_recorder");
                    if ((uVar6 & 1) != 0) {
                      uVar4 = snd_strerror(iVar3);
                      _al_trace_suffix("%s: %s\n",uVar4,
                                       "snd_pcm_hw_params(data->capture_handle, data->hw_params)");
                    }
                  }
                  else {
                    iVar3 = snd_pcm_prepare(*local_18);
                    if (-1 < iVar3) {
                      *(long **)(local_10 + 200) = local_18;
                      uVar4 = al_create_thread(alsa_update_recorder,local_10);
                      *(undefined8 *)(local_10 + 0x80) = uVar4;
                      return 0;
                    }
                    uVar6 = _al_trace_prefix(__al_debug_channel,3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                             ,0x350,"alsa_allocate_recorder");
                    if ((uVar6 & 1) != 0) {
                      uVar4 = snd_strerror(iVar3);
                      _al_trace_suffix("%s: %s\n",uVar4,"snd_pcm_prepare(data->capture_handle)");
                    }
                  }
                }
              }
              else {
                uVar6 = _al_trace_prefix(__al_debug_channel,3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                         ,0x349,"alsa_allocate_recorder");
                if ((uVar6 & 1) != 0) {
                  _al_trace_suffix("Unsupported rate! Requested %u, got %iu.\n",
                                   *(undefined4 *)(local_10 + 0xa0),local_1c);
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001164fd:
  if (local_18 != (long *)0x0) {
    if (local_18[1] != 0) {
      snd_pcm_hw_params_free(local_18[1]);
    }
    if (*local_18 != 0) {
      snd_pcm_close(*local_18);
    }
    al_free_with_context
              (local_18,0x360,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
               ,"alsa_allocate_recorder");
  }
  return 1;
}

Assistant:

static int alsa_allocate_recorder(ALLEGRO_AUDIO_RECORDER *r)
{
   ALSA_RECORDER_DATA *data;
   unsigned int frequency = r->frequency;
   snd_pcm_format_t format;
   const char *device = default_device;
   const char *config_device;
   config_device =
      al_get_config_value(al_get_system_config(), "alsa", "capture_device");
   if (config_device && config_device[0] != '\0')
      device = config_device;

   data = al_calloc(1, sizeof(*data));
   
   if (!data) {
      goto Error;
   }
   
   if (r->depth == ALLEGRO_AUDIO_DEPTH_INT8)
      format = SND_PCM_FORMAT_S8;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_UINT8)
      format = SND_PCM_FORMAT_U8;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_INT16)
      format = SND_PCM_FORMAT_S16;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_UINT16)
      format = SND_PCM_FORMAT_U16;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_INT24)
      format = SND_PCM_FORMAT_S24;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_UINT24)
      format = SND_PCM_FORMAT_U24;
   else if (r->depth == ALLEGRO_AUDIO_DEPTH_FLOAT32)
      format = SND_PCM_FORMAT_FLOAT;
   else
      goto Error;
   
   ALSA_CHECK(snd_pcm_open(&data->capture_handle, device, SND_PCM_STREAM_CAPTURE, 0));
   ALSA_CHECK(snd_pcm_hw_params_malloc(&data->hw_params));
   ALSA_CHECK(snd_pcm_hw_params_any(data->capture_handle, data->hw_params));
   ALSA_CHECK(snd_pcm_hw_params_set_access(data->capture_handle, data->hw_params, SND_PCM_ACCESS_RW_INTERLEAVED));
   ALSA_CHECK(snd_pcm_hw_params_set_format(data->capture_handle, data->hw_params, format));
   ALSA_CHECK(snd_pcm_hw_params_set_rate_near(data->capture_handle, data->hw_params, &frequency, 0));
   
   if (frequency != r->frequency) {
      ALLEGRO_ERROR("Unsupported rate! Requested %u, got %iu.\n", r->frequency, frequency);
      goto Error;
   }
   
   ALSA_CHECK(snd_pcm_hw_params_set_channels(data->capture_handle, data->hw_params, al_get_channel_count(r->chan_conf)));
   ALSA_CHECK(snd_pcm_hw_params(data->capture_handle, data->hw_params));
   
   ALSA_CHECK(snd_pcm_prepare(data->capture_handle));
   
   r->extra = data;
   r->thread = al_create_thread(alsa_update_recorder, r);
   
   return 0;
   
Error:
   
   if (data) {
      if (data->hw_params) {
         snd_pcm_hw_params_free(data->hw_params);
      }
      if (data->capture_handle) {
         snd_pcm_close(data->capture_handle);
      }
      al_free(data);
   }
   
   return 1;
}